

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_flac_get_length_in_pcm_frames(ma_flac *pFlac,ma_uint64 *pLength)

{
  ma_uint64 *pLength_local;
  ma_flac *pFlac_local;
  ma_result local_4;
  
  if (pLength == (ma_uint64 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0;
    if (pFlac == (ma_flac *)0x0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      *pLength = pFlac->dr->totalPCMFrameCount;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_flac_get_length_in_pcm_frames(ma_flac* pFlac, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;   /* Safety. */

    if (pFlac == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_FLAC)
    {
        *pLength = pFlac->dr->totalPCMFrameCount;

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}